

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialUnion.cpp
# Opt level: O0

size_t __thiscall dgrminer::labeled_node::support(labeled_node *this,bool new_measures)

{
  bool bVar1;
  reference piVar2;
  mapped_type *this_00;
  size_type sVar3;
  int local_44;
  iterator iStack_40;
  int snapshotId;
  iterator __end2;
  iterator __begin2;
  set<int,_std::less<int>,_std::allocator<int>_> *__range2;
  size_t new_support;
  bool new_measures_local;
  labeled_node *this_local;
  
  if (new_measures) {
    __range2 = (set<int,_std::less<int>,_std::allocator<int>_> *)0x0;
    __end2 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin(&this->occurrences);
    iStack_40 = std::set<int,_std::less<int>,_std::allocator<int>_>::end(&this->occurrences);
    while( true ) {
      bVar1 = std::operator!=(&__end2,&stack0xffffffffffffffc0);
      if (!bVar1) break;
      piVar2 = std::_Rb_tree_const_iterator<int>::operator*(&__end2);
      local_44 = *piVar2;
      this_00 = std::
                unordered_map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                ::at(&this->multiple_occurrences,&local_44);
      sVar3 = std::set<int,_std::less<int>,_std::allocator<int>_>::size(this_00);
      __range2 = (set<int,_std::less<int>,_std::allocator<int>_> *)
                 (&(__range2->_M_t)._M_impl.field_0x0 + sVar3);
      std::_Rb_tree_const_iterator<int>::operator++(&__end2);
    }
    this_local = (labeled_node *)__range2;
  }
  else {
    this_local = (labeled_node *)
                 std::set<int,_std::less<int>,_std::allocator<int>_>::size(&this->occurrences);
  }
  return (size_t)this_local;
}

Assistant:

size_t labeled_node::support(bool new_measures) {
	  	if (new_measures) {
		  	size_t new_support = 0;
			for (auto snapshotId : occurrences) {
			  	new_support += multiple_occurrences.at(snapshotId).size();
			}

		  	return new_support;
		}
	  	return occurrences.size();
	}